

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlibemu_opl_inc.c
# Opt level: O0

void change_sustainlevel(OPL_DATA_conflict *chip,Bitu regbase,op_type_conflict *op_pt)

{
  uint uVar1;
  double dVar2;
  Bits sustainlevel;
  op_type_conflict *op_pt_local;
  Bitu regbase_local;
  OPL_DATA_conflict *chip_local;
  
  uVar1 = (int)(uint)chip->adlibreg[regbase + 0x80] >> 4;
  if (uVar1 < 0xf) {
    dVar2 = pow(2.0,(double)uVar1 * -0.5);
    op_pt->sustain_level = dVar2;
  }
  else {
    op_pt->sustain_level = 0.0;
  }
  return;
}

Assistant:

static void change_sustainlevel(OPL_DATA* chip, Bitu regbase, op_type* op_pt)
{
	Bits sustainlevel = chip->adlibreg[ARC_SUSL_RELR+regbase]>>4;
	// sustainlevel should be 0.0 when sustainlevel==15 (max)
	if (sustainlevel<15)
	{
		op_pt->sustain_level = (fltype)(pow(FL2,(fltype)sustainlevel * (-FL05)));
	}
	else
	{
		op_pt->sustain_level = 0.0;
	}
}